

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

ALLEGRO_BITMAP * al_get_target_bitmap(void)

{
  long *plVar1;
  ALLEGRO_BITMAP *pAVar2;
  
  plVar1 = (long *)__tls_get_addr(&PTR_001d9500);
  if (*plVar1 == 0) {
    *plVar1 = (long)(plVar1 + 1);
    initialize_tls_values((thread_local_state *)(plVar1 + 1));
  }
  if (*plVar1 == 0) {
    pAVar2 = (ALLEGRO_BITMAP *)0x0;
  }
  else {
    pAVar2 = *(ALLEGRO_BITMAP **)(*plVar1 + 0xd8);
  }
  return pAVar2;
}

Assistant:

ALLEGRO_BITMAP *al_get_target_bitmap(void)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return 0;
   return tls->target_bitmap;
}